

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

ImFont * __thiscall
ImFontAtlas::AddFontFromMemoryTTF
          (ImFontAtlas *this,void *ttf_data,int ttf_size,float size_pixels,
          ImFontConfig *font_cfg_template,ImWchar *glyph_ranges)

{
  ImFont *pIVar1;
  ImFontConfig font_cfg;
  ImFontConfig local_b0;
  
  if (this->Locked == true) {
    __assert_fail("!Locked && \"Cannot modify a locked ImFontAtlas between NewFrame() and EndFrame/Render()!\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui_draw.cpp"
                  ,0x880,
                  "ImFont *ImFontAtlas::AddFontFromMemoryTTF(void *, int, float, const ImFontConfig *, const ImWchar *)"
                 );
  }
  if (font_cfg_template == (ImFontConfig *)0x0) {
    memset(&local_b0,0,0x88);
    local_b0.FontDataOwnedByAtlas = true;
    local_b0.OversampleH = 3;
    local_b0.OversampleV = 1;
    local_b0.GlyphMaxAdvanceX = 3.4028235e+38;
    local_b0.RasterizerMultiply = 1.0;
    local_b0.EllipsisChar = 0xffff;
  }
  else {
    memcpy(&local_b0,font_cfg_template,0x88);
  }
  if (local_b0.FontData == (void *)0x0) {
    local_b0.SizePixels =
         (float)(~-(uint)(0.0 < size_pixels) & (uint)local_b0.SizePixels |
                (uint)size_pixels & -(uint)(0.0 < size_pixels));
    if (glyph_ranges != (ImWchar *)0x0) {
      local_b0.GlyphRanges = glyph_ranges;
    }
    local_b0.FontData = ttf_data;
    local_b0.FontDataSize = ttf_size;
    pIVar1 = AddFont(this,&local_b0);
    return pIVar1;
  }
  __assert_fail("font_cfg.FontData == __null",
                "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui_draw.cpp"
                ,0x882,
                "ImFont *ImFontAtlas::AddFontFromMemoryTTF(void *, int, float, const ImFontConfig *, const ImWchar *)"
               );
}

Assistant:

ImFont* ImFontAtlas::AddFontFromMemoryTTF(void* ttf_data, int ttf_size, float size_pixels, const ImFontConfig* font_cfg_template, const ImWchar* glyph_ranges)
{
    IM_ASSERT(!Locked && "Cannot modify a locked ImFontAtlas between NewFrame() and EndFrame/Render()!");
    ImFontConfig font_cfg = font_cfg_template ? *font_cfg_template : ImFontConfig();
    IM_ASSERT(font_cfg.FontData == NULL);
    font_cfg.FontData = ttf_data;
    font_cfg.FontDataSize = ttf_size;
    font_cfg.SizePixels = size_pixels > 0.0f ? size_pixels : font_cfg.SizePixels;
    if (glyph_ranges)
        font_cfg.GlyphRanges = glyph_ranges;
    return AddFont(&font_cfg);
}